

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::error_code> *
testing::internal::ActionResultHolder<std::error_code>::PerformDefaultAction<std::error_code(bool)>
          (FunctionMocker<std::error_code_(bool)> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  ActionResultHolder<std::error_code> *this;
  Result RVar1;
  error_code value;
  Wrapper result;
  ReferenceOrValueWrapper<std::error_code> local_30;
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<std::error_code_(bool)> *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<std::error_code> *)operator_new(0x18);
  RVar1 = FunctionMocker<std::error_code_(bool)>::PerformDefaultAction
                    ((FunctionMocker<std::error_code_(bool)> *)args_local,
                     (ArgumentTuple *)call_description_local,local_20);
  value._M_cat = RVar1._M_cat;
  value._4_4_ = 0;
  value._M_value = RVar1._M_value;
  ReferenceOrValueWrapper<std::error_code>::ReferenceOrValueWrapper(&local_30,value);
  result.value_._4_4_ = 0;
  result.value_._M_value = local_30.value_._M_value;
  result.value_._M_cat = local_30.value_._M_cat;
  ActionResultHolder(this,result);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }